

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_9a8b::PathTest_PreferredSeparator_Test::TestBody
          (PathTest_PreferredSeparator_Test *this)

{
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper local_20;
  AssertionResult gtest_ar;
  
  local_28.ptr_._0_1_ = 0x2f;
  testing::internal::CmpHelperEQ<char,char>
            ((internal *)&gtest_ar,"\'/\'","path::preferred_separator",(char *)&local_28,
             "//proc/self/exe");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc",0x39,
               message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(PathTest, PreferredSeparator) {
#ifdef _WIN32
  EXPECT_EQ('\\', path::preferred_separator);
#else
  EXPECT_EQ('/', path::preferred_separator);
#endif
}